

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
genVertexSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ulong uVar1;
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec4 a_position;\n"
             ,0x5b);
  uVar1 = (ulong)*(uint *)((long)this + 0xbc);
  if (uVar1 < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01c93b10 + *(int *)(&DAT_01c93b10 + uVar1 * 4),
               *(long *)(&DAT_01c93b28 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"void main (void)\n{\n\tgl_Position = a_position;\n",0x2e);
  uVar1 = (ulong)*(uint *)((long)this + 0xbc);
  if (uVar1 < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01c93ac8 + *(int *)(&DAT_01c93ac8 + uVar1 * 4),
               *(long *)(&DAT_01c93ae0 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}",1);
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
			"in highp vec4 a_position;\n";

	if (m_iteration == 0)
		buf << "sample out highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "sample out highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "sample out highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "sample out highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "sample out highp float[2] v_input;\n";
	else if (m_iteration == 5)
		buf << "struct VaryingStruct { highp float a; highp float b; };\n"
			   "sample out VaryingStruct v_input;\n";
	else
		DE_ASSERT(false);

	buf <<	"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n";

	if (m_iteration == 0)
		buf << "	v_input = a_position.x + exp(a_position.y) + step(0.9, a_position.x)*step(a_position.y, -0.9)*8.0;\n";
	else if (m_iteration == 1)
		buf << "	v_input = a_position.xy;\n";
	else if (m_iteration == 2)
		buf << "	v_input = vec3(a_position.xy, a_position.x * 2.0 - a_position.y);\n";
	else if (m_iteration == 3)
		buf << "	v_input = vec4(a_position.xy, a_position.x * 2.0 - a_position.y, a_position.x*a_position.y);\n";
	else if (m_iteration == 4)
		buf << "	v_input[0] = a_position.x;\n"
			   "	v_input[1] = a_position.y;\n";
	else if (m_iteration == 5)
		buf << "	v_input.a = a_position.x;\n"
			   "	v_input.b = a_position.y;\n";
	else
		DE_ASSERT(false);

	buf <<	"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}